

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall
QStandardItemPrivate::setItemData(QStandardItemPrivate *this,QMap<int,_QVariant> *roles)

{
  QList<QStandardItemData> *this_00;
  const_iterator __last;
  QStandardItem *item;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  long lVar2;
  Data *pDVar3;
  bool bVar4;
  bool bVar5;
  compare_eq_result_container<QList<QStandardItemData>,_QStandardItemData> cVar6;
  _Rb_tree_color _Var7;
  iterator iVar8;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  _Rb_tree_node_base *p_Var12;
  const_iterator copy;
  const_iterator __first;
  qsizetype qVar13;
  iterator __i;
  QStandardItemData *pQVar14;
  bool bVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<QStandardItemData> local_88;
  _Rb_tree_color local_6c;
  QStandardItemData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item = this->q_ptr;
  this_00 = &this->values;
  iVar8 = QList<QStandardItemData>::begin(this_00);
  iVar9 = QList<QStandardItemData>::end(this_00);
  if (iVar8.i != iVar9.i) {
    uVar11 = ((long)iVar9.i - (long)iVar8.i >> 3) * -0x3333333333333333;
    lVar2 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QStandardItemData>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
              (iVar8.i,iVar9.i,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)iVar9.i - (long)iVar8.i < 0x281) {
      std::
      __insertion_sort<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                (iVar8.i,iVar9.i);
    }
    else {
      pQVar14 = iVar8.i + 0x10;
      std::
      __insertion_sort<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                (iVar8.i,pQVar14);
      for (; pQVar14 != iVar9.i; pQVar14 = pQVar14 + 1) {
        std::
        __unguarded_linear_insert<QList<QStandardItemData>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QStandardItemPrivate::setItemData(QMap<int,QVariant>const&)::__0>>
                  (pQVar14);
      }
    }
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (QStandardItemData *)0x0;
  local_88.size = 0;
  QList<QStandardItemData>::reserve((QList<QStandardItemData> *)&local_88,(this->values).d.size);
  pQVar1 = (roles->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var10 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var10 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var12 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var12 = (_Rb_tree_node_base *)0x0;
  }
  __first.i = (this->values).d.ptr;
  __last.i = __first.i + (this->values).d.size;
  while (p_Var10 != p_Var12) {
    if (__first.i == __last.i) {
      if (p_Var10 != p_Var12) {
        do {
          if (3 < *(ulong *)(p_Var10 + 2)) {
            _Var7 = p_Var10[1]._M_color;
            if (_Var7 == 2) {
              _Var7 = _S_red;
            }
            local_68.role = _Var7;
            ::QVariant::QVariant(&local_68.value,(QVariant *)&p_Var10[1]._M_parent);
            QtPrivate::QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData>
                      ((QMovableArrayOps<QStandardItemData> *)&local_88,local_88.size,&local_68);
            QList<QStandardItemData>::end((QList<QStandardItemData> *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_68.value);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != p_Var12);
      }
      goto LAB_005504c2;
    }
    _Var7 = p_Var10[1]._M_color;
    if (p_Var10[1]._M_color == 2) {
      _Var7 = _S_red;
    }
    if ((__first.i)->role < (int)_Var7) {
      QtPrivate::QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData_const&>
                ((QMovableArrayOps<QStandardItemData> *)&local_88,local_88.size,__first.i);
      QList<QStandardItemData>::end((QList<QStandardItemData> *)&local_88);
      __first.i = __first.i + 1;
    }
    else {
      if (3 < *(ulong *)(p_Var10 + 2)) {
        _Var7 = p_Var10[1]._M_color;
        if (p_Var10[1]._M_color == 2) {
          _Var7 = _S_red;
        }
        local_68._4_4_ = SUB84((ulong)local_68._0_8_ >> 0x20,0);
        local_68.role = _Var7;
        ::QVariant::QVariant(&local_68.value,(QVariant *)&p_Var10[1]._M_parent);
        QtPrivate::QMovableArrayOps<QStandardItemData>::emplace<QStandardItemData>
                  ((QMovableArrayOps<QStandardItemData> *)&local_88,local_88.size,&local_68);
        QList<QStandardItemData>::end((QList<QStandardItemData> *)&local_88);
        ::QVariant::~QVariant((QVariant *)&local_68.value);
      }
      _Var7 = p_Var10[1]._M_color;
      if (p_Var10[1]._M_color == 2) {
        _Var7 = _S_red;
      }
      if ((__first.i)->role <= (int)_Var7) {
        __first.i = __first.i + 1;
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<QList<QStandardItemData>::const_iterator,std::back_insert_iterator<QList<QStandardItemData>>>
            (__first,__last,(QList<QStandardItemData> *)&local_88);
LAB_005504c2:
  cVar6 = QList<QStandardItemData>::operator==((QList<QStandardItemData> *)&local_88,this_00);
  if (cVar6) goto LAB_0055065c;
  pDVar3 = (this->values).d.d;
  pQVar14 = (this->values).d.ptr;
  (this->values).d.d = local_88.d;
  (this->values).d.ptr = local_88.ptr;
  qVar13 = (this->values).d.size;
  (this->values).d.size = local_88.size;
  local_88.d = pDVar3;
  local_88.ptr = pQVar14;
  local_88.size = qVar13;
  if (this->model == (QStandardItemModel *)0x0) goto LAB_0055065c;
  local_68._0_8_ = (QArrayData *)0x0;
  local_68.value.d.data.shared = (PrivateShared *)0x0;
  local_68.value.d.data._8_8_ = 0;
  pQVar1 = (roles->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    qVar13 = 1;
  }
  else {
    qVar13 = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
  }
  QList<int>::reserve((QList<int> *)&local_68,qVar13);
  pQVar1 = (roles->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var10 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var10 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  pQVar1 = (roles->d).d.ptr;
  p_Var12 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                 *)0x0) {
    p_Var12 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var10 == p_Var12) {
    bVar4 = false;
    bVar15 = false;
  }
  else {
    bVar15 = false;
    bVar5 = false;
    do {
      local_6c = p_Var10[1]._M_color;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_68,local_68.value.d.data._8_8_,(int *)&local_6c);
      QList<int>::end((QList<int> *)&local_68);
      bVar4 = bVar5;
      if (p_Var10[1]._M_color == _S_red) {
        bVar4 = true;
      }
      if (p_Var10[1]._M_color == 2) {
        bVar15 = true;
        bVar4 = bVar5;
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      pQVar1 = (roles->d).d.ptr;
      p_Var12 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar1 == (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        p_Var12 = (_Rb_tree_node_base *)0x0;
      }
      bVar5 = bVar4;
    } while (p_Var10 != p_Var12);
  }
  if (bVar15) {
    if (!bVar4) {
      local_6c = _S_red;
LAB_00550605:
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_68,local_68.value.d.data._8_8_,(int *)&local_6c);
      QList<int>::end((QList<int> *)&local_68);
    }
  }
  else if (bVar4) {
    local_6c = 2;
    goto LAB_00550605;
  }
  QStandardItemModelPrivate::itemChanged
            (*(QStandardItemModelPrivate **)&this->model->field_0x8,item,(QList<int> *)&local_68);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,4,0x10);
    }
  }
LAB_0055065c:
  QArrayDataPointer<QStandardItemData>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::setItemData(const QMap<int, QVariant> &roles)
{
    Q_Q(QStandardItem);

    auto byRole = [](const QStandardItemData& item1, const QStandardItemData& item2) {
        return item1.role < item2.role;
    };

    std::sort(values.begin(), values.end(), byRole);

    /*
        Create a list of QStandardItemData that will contain the original values
        if the matching role is not contained in roles, the new value if it is and
        if the new value is an invalid QVariant, it will be removed.
    */
    QList<QStandardItemData> newValues;
    newValues.reserve(values.size());
    roleMapStandardItemDataUnion(roles.keyValueBegin(),
                                 roles.keyValueEnd(),
                                 values.cbegin(), values.cend(),
                                 std::back_inserter(newValues), ByNormalizedRole());

    if (newValues != values) {
        values.swap(newValues);
        if (model) {
            QList<int> roleKeys;
            roleKeys.reserve(roles.size() + 1);
            bool hasEditRole = false;
            bool hasDisplayRole = false;
            for (auto it = roles.keyBegin(); it != roles.keyEnd(); ++it) {
                roleKeys.push_back(*it);
                if (*it == Qt::EditRole)
                    hasEditRole = true;
                else if (*it == Qt::DisplayRole)
                    hasDisplayRole = true;
            }
            if (hasEditRole && !hasDisplayRole)
                roleKeys.push_back(Qt::DisplayRole);
            else if (!hasEditRole && hasDisplayRole)
                roleKeys.push_back(Qt::EditRole);
            model->d_func()->itemChanged(q, roleKeys);
        }
    }
}